

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  uint32 uVar4;
  FieldDescriptor *pFVar5;
  MapValueRef *this_00;
  int64 iVar6;
  uint64 uVar7;
  Reflection *val;
  LogMessage *pLVar8;
  LogMessage *val_00;
  long in_RDI;
  float fVar9;
  double dVar10;
  Message *value_9;
  Message *message;
  int32 *value_8;
  string *value_7;
  bool *value_6;
  float *value_5;
  double *value_4;
  uint64 *value_3;
  uint32 *value_2;
  int64 *value_1;
  int32 *value;
  MapValueRef *map_val;
  iterator iter_1;
  MapKey map_key;
  iterator it;
  iterator iter;
  FieldDescriptor *val_des;
  FieldDescriptor *key_des;
  Reflection *reflection;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  LogMessage *in_stack_fffffffffffffbc8;
  LogMessage *in_stack_fffffffffffffbd0;
  Reflection *in_stack_fffffffffffffbd8;
  LogMessage *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  Reflection *in_stack_fffffffffffffbf0;
  Reflection *in_stack_fffffffffffffbf8;
  Reflection *in_stack_fffffffffffffc00;
  MapValueRef *in_stack_fffffffffffffc20;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_fffffffffffffc30;
  string local_1d0 [32];
  MapValueRef *local_1b0;
  void *local_1a8;
  float *local_1a0;
  double *local_198;
  uint64 *local_190;
  uint32 *local_188;
  int64 *local_180;
  int32 *local_178;
  MapValueRef *local_170;
  string local_f8 [48];
  iterator local_c8;
  RepeatedPtrIterator<google::protobuf::Message> local_c0 [7];
  allocator local_81;
  string local_80 [32];
  FieldDescriptor *local_60;
  allocator local_41;
  string local_40 [32];
  FieldDescriptor *local_20;
  Reflection *local_18;
  long local_10;
  
  local_10 = in_RDI + 0x48;
  local_18 = Message::GetReflection((Message *)in_stack_fffffffffffffbd0);
  Message::GetDescriptor((Message *)in_stack_fffffffffffffbd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"key",&local_41);
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                      (string *)in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pFVar5;
  Message::GetDescriptor((Message *)in_stack_fffffffffffffbd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"value",&local_81);
  pFVar5 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                      (string *)in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = pFVar5;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             in_stack_fffffffffffffbf0);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffbf0);
    bVar1 = protobuf::operator!=
                      ((iterator *)in_stack_fffffffffffffbd0,(iterator *)in_stack_fffffffffffffbc8);
    if (!bVar1) break;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
              ((iterator *)0x432411);
    MapValueRef::DeleteData(in_stack_fffffffffffffc20);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
              ((iterator *)in_stack_fffffffffffffbd0);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(in_stack_fffffffffffffc30);
  local_c0[0].it_ =
       (void **)RepeatedPtrField<google::protobuf::Message>::begin
                          ((RepeatedPtrField<google::protobuf::Message> *)in_stack_fffffffffffffbc8)
  ;
  while( true ) {
    local_c8.it_ = (void **)RepeatedPtrField<google::protobuf::Message>::end
                                      ((RepeatedPtrField<google::protobuf::Message> *)
                                       in_stack_fffffffffffffbd8);
    bVar1 = RepeatedPtrIterator<google::protobuf::Message>::operator!=(local_c0,&local_c8);
    if (!bVar1) break;
    MapKey::MapKey((MapKey *)in_stack_fffffffffffffbd0);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x432535);
    switch(CVar2) {
    case CPPTYPE_INT32:
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetInt32
                ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (Message *)in_stack_fffffffffffffbe0,(FieldDescriptor *)in_stack_fffffffffffffbd8);
      MapKey::SetInt32Value
                ((MapKey *)in_stack_fffffffffffffbd0,
                 (int32)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
      break;
    case CPPTYPE_INT64:
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetInt64
                ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (Message *)in_stack_fffffffffffffbe0,(FieldDescriptor *)in_stack_fffffffffffffbd8);
      MapKey::SetInt64Value((MapKey *)in_stack_fffffffffffffbd0,(int64)in_stack_fffffffffffffbc8);
      break;
    case CPPTYPE_UINT32:
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetUInt32
                ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (Message *)in_stack_fffffffffffffbe0,(FieldDescriptor *)in_stack_fffffffffffffbd8);
      MapKey::SetUInt32Value
                ((MapKey *)in_stack_fffffffffffffbd0,
                 (uint32)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
      break;
    case CPPTYPE_UINT64:
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetUInt64
                ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                 (Message *)in_stack_fffffffffffffbe0,(FieldDescriptor *)in_stack_fffffffffffffbd8);
      MapKey::SetUInt64Value((MapKey *)in_stack_fffffffffffffbd0,(uint64)in_stack_fffffffffffffbc8);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                (in_stack_fffffffffffffbe0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                 (char *)in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
      LogMessage::operator<<(in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      LogMessage::~LogMessage((LogMessage *)0x43289c);
      break;
    case CPPTYPE_BOOL:
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetBool((Reflection *)
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                          (Message *)in_stack_fffffffffffffbe0,
                          (FieldDescriptor *)in_stack_fffffffffffffbd8);
      MapKey::SetBoolValue
                ((MapKey *)in_stack_fffffffffffffbd0,
                 SUB81((ulong)in_stack_fffffffffffffbc8 >> 0x38,0));
      break;
    case CPPTYPE_STRING:
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetString_abi_cxx11_
                (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8,
                 (FieldDescriptor *)in_stack_fffffffffffffbf0);
      MapKey::SetStringValue
                ((MapKey *)in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8);
      std::__cxx11::string::~string(local_f8);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffbf0,
               (key_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffbf0);
    bVar1 = protobuf::operator!=
                      ((iterator *)in_stack_fffffffffffffbd0,(iterator *)in_stack_fffffffffffffbc8);
    if (bVar1) {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                ((iterator *)0x432932);
      MapValueRef::DeleteData(in_stack_fffffffffffffc20);
    }
    this_00 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                        ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                         in_stack_fffffffffffffbe0,(key_type *)in_stack_fffffffffffffbd8);
    local_170 = this_00;
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x43299d);
    MapValueRef::SetType(this_00,CVar2);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4329c9);
    switch(CVar2) {
    case CPPTYPE_INT32:
      local_178 = (int32 *)operator_new(4);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      iVar3 = Reflection::GetInt32
                        ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                         ,(Message *)in_stack_fffffffffffffbe0,
                         (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *local_178 = iVar3;
      MapValueRef::SetValue(local_170,local_178);
      break;
    case CPPTYPE_INT64:
      local_180 = (int64 *)operator_new(8);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      iVar6 = Reflection::GetInt64
                        ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                         ,(Message *)in_stack_fffffffffffffbe0,
                         (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *local_180 = iVar6;
      MapValueRef::SetValue(local_170,local_180);
      break;
    case CPPTYPE_UINT32:
      local_188 = (uint32 *)operator_new(4);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      uVar4 = Reflection::GetUInt32
                        ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                         ,(Message *)in_stack_fffffffffffffbe0,
                         (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *local_188 = uVar4;
      MapValueRef::SetValue(local_170,local_188);
      break;
    case CPPTYPE_UINT64:
      local_190 = (uint64 *)operator_new(8);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      uVar7 = Reflection::GetUInt64
                        ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                         ,(Message *)in_stack_fffffffffffffbe0,
                         (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *local_190 = uVar7;
      MapValueRef::SetValue(local_170,local_190);
      break;
    case CPPTYPE_DOUBLE:
      local_198 = (double *)operator_new(8);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      dVar10 = Reflection::GetDouble
                         ((Reflection *)
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                          (Message *)in_stack_fffffffffffffbe0,
                          (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *local_198 = dVar10;
      MapValueRef::SetValue(local_170,local_198);
      break;
    case CPPTYPE_FLOAT:
      local_1a0 = (float *)operator_new(4);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      fVar9 = Reflection::GetFloat
                        ((Reflection *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                         ,(Message *)in_stack_fffffffffffffbe0,
                         (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *local_1a0 = fVar9;
      MapValueRef::SetValue(local_170,local_1a0);
      break;
    case CPPTYPE_BOOL:
      local_1a8 = operator_new(1);
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      bVar1 = Reflection::GetBool((Reflection *)
                                  CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                                  (Message *)in_stack_fffffffffffffbe0,
                                  (FieldDescriptor *)in_stack_fffffffffffffbd8);
      *(bool *)local_1a8 = bVar1;
      MapValueRef::SetValue(local_170,local_1a8);
      break;
    case CPPTYPE_ENUM:
      val = (Reflection *)operator_new(4);
      in_stack_fffffffffffffbf0 = local_18;
      in_stack_fffffffffffffc00 = val;
      in_stack_fffffffffffffbf8 =
           (Reflection *)RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      in_stack_fffffffffffffbec =
           Reflection::GetEnumValue
                     (in_stack_fffffffffffffbf0,
                      (Message *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                      (FieldDescriptor *)in_stack_fffffffffffffbe0);
      *(int *)&val->descriptor_ = in_stack_fffffffffffffbec;
      MapValueRef::SetValue(local_170,val);
      break;
    case CPPTYPE_STRING:
      in_stack_fffffffffffffc20 = (MapValueRef *)operator_new(0x20);
      std::__cxx11::string::string((string *)in_stack_fffffffffffffc20);
      local_1b0 = in_stack_fffffffffffffc20;
      RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      Reflection::GetString_abi_cxx11_
                (in_stack_fffffffffffffc00,(Message *)in_stack_fffffffffffffbf8,
                 (FieldDescriptor *)in_stack_fffffffffffffbf0);
      std::__cxx11::string::operator=((string *)local_1b0,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      MapValueRef::SetValue(local_170,local_1b0);
      break;
    case CPPTYPE_MESSAGE:
      in_stack_fffffffffffffbd8 = local_18;
      in_stack_fffffffffffffbe0 =
           (LogMessage *)RepeatedPtrIterator<google::protobuf::Message>::operator*(local_c0);
      pLVar8 = (LogMessage *)
               Reflection::GetMessage
                         (in_stack_fffffffffffffbf8,(Message *)in_stack_fffffffffffffbf0,
                          (FieldDescriptor *)
                          CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                          (MessageFactory *)in_stack_fffffffffffffbe0);
      in_stack_fffffffffffffbd0 = pLVar8;
      val_00 = (LogMessage *)(**(code **)((long)*(MessageLite *)pLVar8 + 0x18))();
      in_stack_fffffffffffffbc8 = val_00;
      (**(code **)(*(long *)val_00 + 0x80))(val_00,pLVar8);
      MapValueRef::SetValue(local_170,val_00);
    }
    MapKey::~MapKey((MapKey *)in_stack_fffffffffffffbd0);
    RepeatedPtrIterator<google::protobuf::Message>::operator++(local_c0);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    // Remove existing map value with same key.
    Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
    if (iter != map->end()) {
      iter->second.DeleteData();
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)          \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
    TYPE* value = new TYPE;                         \
    *value = reflection->Get##METHOD(*it, val_des); \
    map_val.SetValue(value);                        \
    break;                                          \
  }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New();
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}